

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
::internal_clear(btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
                 *this,node_type *node)

{
  btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
  *this_00;
  node_type *node_00;
  node_type *i;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (*(char *)((long)&this->rightmost_ + 3) != '\0') {
    delete_leaf_node(this,node);
    return;
  }
  i = (node_type *)0xffffffffffffffff;
  do {
    i = i + 1;
    node_00 = i;
    this_00 = (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
               *)btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
                 ::child((btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
                          *)this,(size_type)i);
    internal_clear(this_00,node_00);
  } while (i < (node_type *)(ulong)*(byte *)((long)&this->rightmost_ + 2));
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
  ::destroy((btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
             *)this,(allocator_type *)node_00);
  operator_delete(this,0x130);
  return;
}

Assistant:

void btree<P>::internal_clear(node_type *node) {
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                internal_clear(node->child(i));
            }
            delete_internal_node(node);
        } else {
            delete_leaf_node(node);
        }
    }